

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxlen.cc
# Opt level: O0

void __thiscall re2c::Node::calc_dist(Node *this)

{
  bool bVar1;
  pointer ppVar2;
  uint *puVar3;
  uint local_38 [4];
  _Self local_28;
  _Self local_20;
  iterator i;
  local_inc _;
  Node *this_local;
  
  if (this->dist == 0xffffffff) {
    bVar1 = end(this);
    if (bVar1) {
      this->dist = 0;
    }
    else if (this->loop < 2) {
      local_increment_t<unsigned_char>::local_increment_t
                ((local_increment_t<unsigned_char> *)&i,&this->loop);
      local_20._M_node =
           (_Base_ptr)
           std::
           map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::begin(&this->arcs);
      while( true ) {
        local_28._M_node =
             (_Base_ptr)
             std::
             map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::end(&this->arcs);
        bVar1 = std::operator!=(&local_20,&local_28);
        if (!bVar1) break;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_20);
        calc_dist(ppVar2->first);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_20);
        if (ppVar2->first->dist != 0xffffffff) {
          if (this->dist == 0xffffffff) {
            ppVar2 = std::
                     _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator->(&local_20);
            this->dist = ppVar2->first->dist;
          }
          else {
            ppVar2 = std::
                     _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator->(&local_20);
            puVar3 = std::max<unsigned_int>(&this->dist,&ppVar2->first->dist);
            this->dist = *puVar3;
          }
        }
        std::
        _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator++(&local_20);
      }
      local_38[0] = this->dist + 1;
      puVar3 = std::min<unsigned_int>(local_38,&DIST_MAX);
      this->dist = *puVar3;
      local_increment_t<unsigned_char>::~local_increment_t((local_increment_t<unsigned_char> *)&i);
    }
  }
  return;
}

Assistant:

void Node::calc_dist ()
{
	if (dist != DIST_ERROR)
	{
		return;
	}
	else if (end ())
	{
		dist = 0;
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin (); i != arcs.end (); ++i)
		{
			i->first->calc_dist ();
			if (i->first->dist != DIST_ERROR)
			{
				if (dist == DIST_ERROR)
				{
					dist = i->first->dist;
				}
				else
				{
					dist = std::max (dist, i->first->dist);
				}
			}
		}
		dist = std::min (dist + 1, DIST_MAX);
	}
}